

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O0

void __thiscall
sglr::ReferenceContext::readPixels
          (ReferenceContext *this,int x,int y,int width,int height,deUint32 format,deUint32 type,
          void *data)

{
  deBool dVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  deInt32 rowPitch;
  ConstPixelBufferAccess *pCVar5;
  void *data_00;
  MultisamplePixelBufferAccess local_110;
  MultisampleConstPixelBufferAccess local_e8;
  PixelBufferAccess local_c0;
  undefined1 local_98 [8];
  PixelBufferAccess dst;
  int copyHeight;
  int copyWidth;
  int copyY;
  int copyX;
  TextureFormat local_58;
  TextureFormat transferFmt;
  MultisamplePixelBufferAccess src;
  deUint32 format_local;
  int height_local;
  int width_local;
  int y_local;
  int x_local;
  ReferenceContext *this_local;
  
  getReadColorbuffer((MultisamplePixelBufferAccess *)&transferFmt,this);
  tcu::TextureFormat::TextureFormat(&local_58);
  local_58 = glu::mapGLTransferFormat(format,type);
  while ((local_58.order != CHANNELORDER_LAST && (local_58.type != CHANNELTYPE_LAST))) {
    dVar1 = ::deGetFalse();
    if (dVar1 == 0) {
      pCVar5 = &rr::MultisamplePixelBufferAccess::raw((MultisamplePixelBufferAccess *)&transferFmt)
                ->super_ConstPixelBufferAccess;
      iVar2 = tcu::ConstPixelBufferAccess::getHeight(pCVar5);
      iVar2 = ::deClamp32(x,0,iVar2);
      pCVar5 = &rr::MultisamplePixelBufferAccess::raw((MultisamplePixelBufferAccess *)&transferFmt)
                ->super_ConstPixelBufferAccess;
      iVar3 = tcu::ConstPixelBufferAccess::getDepth(pCVar5);
      iVar3 = ::deClamp32(y,0,iVar3);
      pCVar5 = &rr::MultisamplePixelBufferAccess::raw((MultisamplePixelBufferAccess *)&transferFmt)
                ->super_ConstPixelBufferAccess;
      iVar4 = tcu::ConstPixelBufferAccess::getHeight(pCVar5);
      dst.super_ConstPixelBufferAccess.m_data._4_4_ = ::deClamp32(width,0,iVar4 - x);
      pCVar5 = &rr::MultisamplePixelBufferAccess::raw((MultisamplePixelBufferAccess *)&transferFmt)
                ->super_ConstPixelBufferAccess;
      iVar4 = tcu::ConstPixelBufferAccess::getDepth(pCVar5);
      dst.super_ConstPixelBufferAccess.m_data._0_4_ = ::deClamp32(height,0,iVar4 - y);
      iVar4 = tcu::TextureFormat::getPixelSize(&local_58);
      rowPitch = deAlign32(width * iVar4,this->m_pixelPackAlignment);
      data_00 = getPixelPackPtr(this,data);
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)local_98,&local_58,width,height,1,rowPitch,0,data_00);
      tcu::getSubregion(&local_c0,(PixelBufferAccess *)local_98,0,0,
                        dst.super_ConstPixelBufferAccess.m_data._4_4_,
                        (int)dst.super_ConstPixelBufferAccess.m_data);
      rr::getSubregion(&local_110,(MultisamplePixelBufferAccess *)&transferFmt,iVar2,iVar3,
                       dst.super_ConstPixelBufferAccess.m_data._4_4_,
                       (int)dst.super_ConstPixelBufferAccess.m_data);
      rr::MultisampleConstPixelBufferAccess::MultisampleConstPixelBufferAccess(&local_e8,&local_110)
      ;
      rr::resolveMultisampleColorBuffer(&local_c0,&local_e8);
      return;
    }
  }
  setError(this,0x500);
  return;
}

Assistant:

void ReferenceContext::readPixels (int x, int y, int width, int height, deUint32 format, deUint32 type, void* data)
{
	rr::MultisamplePixelBufferAccess	src = getReadColorbuffer();
	TextureFormat						transferFmt;

	// Map transfer format.
	transferFmt = glu::mapGLTransferFormat(format, type);
	RC_IF_ERROR(transferFmt.order	== TextureFormat::CHANNELORDER_LAST ||
				transferFmt.type	== TextureFormat::CHANNELTYPE_LAST, GL_INVALID_ENUM, RC_RET_VOID);

	// Clamp input values
	const int copyX			= deClamp32(x,		0, src.raw().getHeight());
	const int copyY			= deClamp32(y,		0, src.raw().getDepth());
	const int copyWidth		= deClamp32(width,	0, src.raw().getHeight()-x);
	const int copyHeight	= deClamp32(height,	0, src.raw().getDepth()-y);

	PixelBufferAccess dst(transferFmt, width, height, 1, deAlign32(width*transferFmt.getPixelSize(), m_pixelPackAlignment), 0, getPixelPackPtr(data));
	rr::resolveMultisampleColorBuffer(tcu::getSubregion(dst, 0, 0, copyWidth, copyHeight), rr::getSubregion(src, copyX, copyY, copyWidth, copyHeight));
}